

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::DBTest_ComparatorCheck_Test::TestBody(DBTest_ComparatorCheck_Test *this)

{
  _func_int **pp_Var1;
  long lVar2;
  _Alloc_hider _Var3;
  char *in_R9;
  Status s;
  NewComparator cmp;
  Options new_options;
  undefined1 local_f0 [8];
  Message local_e8;
  _Alloc_hider local_e0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  undefined1 local_d0 [8];
  string local_c8;
  string local_a8;
  AssertHelper local_88;
  Options local_80;
  
  local_d0 = (undefined1  [8])&PTR__Comparator_001a67a0;
  DBTest::CurrentOptions(&local_80,&this->super_DBTest);
  local_80.comparator = (Comparator *)local_d0;
  DBTest::TryReopen((DBTest *)local_f0,(Options *)this);
  local_c8._M_dataplus._M_p._0_1_ = local_f0 != (undefined1  [8])0x0;
  local_c8._M_string_length = 0;
  if (local_f0 == (undefined1  [8])0x0) {
    testing::Message::Message(&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)(local_d0 + 8),(AssertionResult *)"!s.ok()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x5f7,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    _Var3._M_p = (pointer)local_c8._M_string_length;
    if ((long *)CONCAT71(local_e8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_e8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_e8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_e8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
      _Var3._M_p = (pointer)local_c8._M_string_length;
    }
  }
  else {
    Status::ToString_abi_cxx11_(&local_a8,(Status *)local_f0);
    lVar2 = std::__cxx11::string::find((char *)&local_a8,0x17c3fd,0);
    local_e8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(lVar2 != -1);
    local_e0._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (lVar2 != -1) goto LAB_00128034;
    testing::Message::Message((Message *)&local_d8);
    Status::ToString_abi_cxx11_(&local_a8,(Status *)local_f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_d8._M_head_impl + 0x10),local_a8._M_dataplus._M_p,
               local_a8._M_string_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(local_d0 + 8),(internal *)&local_e8,
               (AssertionResult *)"s.ToString().find(\"comparator\") != std::string::npos","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x5f8,(char *)CONCAT71(local_c8._M_dataplus._M_p._1_7_,
                                       local_c8._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._M_dataplus._M_p._1_7_,local_c8._M_dataplus._M_p._0_1_) !=
        &local_c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_c8._M_dataplus._M_p._1_7_,local_c8._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    _Var3._M_p = local_e0._M_p;
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
      _Var3._M_p = local_e0._M_p;
    }
  }
  if ((SpecialEnv *)_Var3._M_p != (SpecialEnv *)0x0) {
    pp_Var1 = (((SpecialEnv *)_Var3._M_p)->super_EnvWrapper).super_Env._vptr_Env;
    if ((atomic<bool> *)pp_Var1 != &((SpecialEnv *)_Var3._M_p)->delay_data_sync_) {
      operator_delete(pp_Var1);
    }
    operator_delete(_Var3._M_p);
  }
LAB_00128034:
  if (local_f0 != (undefined1  [8])0x0) {
    operator_delete__((void *)local_f0);
  }
  Comparator::~Comparator((Comparator *)local_d0);
  return;
}

Assistant:

TEST_F(DBTest, ComparatorCheck) {
  class NewComparator : public Comparator {
   public:
    const char* Name() const override { return "leveldb.NewComparator"; }
    int Compare(const Slice& a, const Slice& b) const override {
      return BytewiseComparator()->Compare(a, b);
    }
    void FindShortestSeparator(std::string* s, const Slice& l) const override {
      BytewiseComparator()->FindShortestSeparator(s, l);
    }
    void FindShortSuccessor(std::string* key) const override {
      BytewiseComparator()->FindShortSuccessor(key);
    }
  };
  NewComparator cmp;
  Options new_options = CurrentOptions();
  new_options.comparator = &cmp;
  Status s = TryReopen(&new_options);
  ASSERT_TRUE(!s.ok());
  ASSERT_TRUE(s.ToString().find("comparator") != std::string::npos)
      << s.ToString();
}